

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void kj::_::
     freePromise<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>>>
               (AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
                *ptr)

{
  AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
  *ptr_local;
  
  dtor<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>>>
            (ptr);
  return;
}

Assistant:

static void freePromise(T* ptr) {
  // Free a PromiseNode originally allocated using `allocPromise<T>()`. The implementation of
  // PromiseNode::destroy() must call this for any type that is allocated using allocPromise().

  if constexpr (PromiseDisposer::canArenaAllocate<T>()) {
    // The object will have been allocated in an arena, so we only want to run the destructor.
    // The arena's memory will be freed separately.
    kj::dtor(*ptr);
  } else {
    // The object will have been allocated separately on the heap.
    return delete ptr;
  }
}